

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint
          (ConstraintsGroupPimpl *this,shared_ptr<iDynTree::optimalcontrol::Constraint> *constraint,
          TimeRange *timeRange)

{
  Constraint *this_00;
  element_type *peVar1;
  double dVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  iterator iVar7;
  string *psVar8;
  ostream *poVar9;
  char *pcVar10;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>,_bool>
  pVar11;
  TimedConstraint_ptr newConstraint;
  SparsityStructure newConstraintControlHessianSparsity;
  SparsityStructure newConstraintStateHessianSparsity;
  SparsityStructure newConstraintMixedHessianSparsity;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> local_280;
  SparsityStructure local_270;
  SparsityStructure local_208 [3];
  SparsityStructure local_90;
  
  this_00 = (constraint->
            super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  if (this_00 == (Constraint *)0x0) {
    pcVar10 = "Empty constraint pointer.";
LAB_001adb63:
    iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar10);
    return false;
  }
  sVar6 = Constraint::constraintSize(this_00);
  if (this->maxConstraintSize < sVar6) {
    pcVar10 = "The constraint dimension is greater than the maximum allowed by the group.";
    goto LAB_001adb63;
  }
  TimeRange::AnyTime();
  bVar4 = TimeRange::operator==(timeRange,(TimeRange *)local_208);
  if (bVar4) {
    if ((this->group)._M_h._M_element_count != 0) {
      pcVar10 = "Only one constraint is allowed in a group if the timeRange is AnyTime.";
      goto LAB_001adb63;
    }
  }
  else {
    bVar4 = TimeRange::isValid(timeRange);
    if (!bVar4) {
      pcVar10 = "Invalid timeRange.";
      goto LAB_001adb63;
    }
    if ((this->group)._M_h._M_element_count != 0) {
      psVar8 = Constraint::name_abi_cxx11_
                         ((constraint->
                          super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr);
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,psVar8);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar9 = std::operator<<((ostream *)local_208,"A constraint named ");
        psVar8 = Constraint::name_abi_cxx11_
                           ((constraint->
                            super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        poVar9 = std::operator<<(poVar9," already exists in the group ");
        poVar9 = std::operator<<(poVar9,(string *)&this->name);
        std::operator<<(poVar9," .");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","addConstraint",(char *)local_270.m_register._M_h._M_buckets);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
        return false;
      }
    }
  }
  std::make_shared<iDynTree::optimalcontrol::TimedConstraint>();
  ((local_280.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->timeRange).m_anyTime = timeRange->m_anyTime;
  dVar2 = timeRange->m_endTime;
  ((local_280.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->timeRange).m_initTime = timeRange->m_initTime;
  ((local_280.
    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   )->timeRange).m_endTime = dVar2;
  std::__shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2> *)
             local_280.
             super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&constraint->
                      super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
            );
  peVar3 = local_280.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  Constraint::constraintSize
            ((constraint->
             super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  iDynTree::VectorDynSize::resize((ulong)&peVar3->constraintBuffer);
  peVar3 = local_280.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar6 = Constraint::constraintSize
                    ((constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  (*((constraint->
     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Constraint[6])();
  iDynTree::MatrixDynSize::resize((ulong)&peVar3->stateJacobianBuffer,sVar6 & 0xffffffff);
  peVar3 = local_280.
           super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar6 = Constraint::constraintSize
                    ((constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  (*((constraint->
     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Constraint[7])();
  iDynTree::MatrixDynSize::resize((ulong)&peVar3->controlJacobianBuffer,sVar6 & 0xffffffff);
  Constraint::constraintSize
            ((constraint->
             super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  iDynTree::VectorDynSize::resize
            ((ulong)&(local_280.
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->lambdaBuffer);
  psVar8 = Constraint::name_abi_cxx11_
                     ((constraint->
                      super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  ::pair<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
              *)local_208,psVar8,&local_280);
  pVar11 = std::
           _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>
                     ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)this,local_208);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>
           *)local_208);
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    poVar9 = std::operator<<((ostream *)local_208,"Unable to add constraint ");
    psVar8 = Constraint::name_abi_cxx11_
                       ((constraint->
                        super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar9 = std::operator<<(poVar9,(string *)psVar8);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("ConstraintsGroup","addConstraint",(char *)local_270.m_register._M_h._M_buckets);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  }
  else {
    std::
    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
    ::push_back(&this->orderedIntervals,
                (value_type *)
                ((long)pVar11.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
                + 0x28));
    std::
    __sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::addConstraint(std::shared_ptr<iDynTree::optimalcontrol::Constraint>,iDynTree::optimalcontrol::TimeRange_const&)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&,std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
              ((this->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    SparsityStructure::SparsityStructure(local_208);
    SparsityStructure::SparsityStructure(&local_270);
    if ((this->stateJacobianSparsityProvided != true) ||
       (peVar1 = (constraint->
                 super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr, iVar5 = (*peVar1->_vptr_Constraint[8])(peVar1,local_208),
       (char)iVar5 == '\0')) {
      this->stateJacobianSparsityProvided = false;
LAB_001adc0a:
      if ((this->controlJacobianSparsityProvided == true) &&
         (peVar1 = (constraint->
                   super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar5 = (*peVar1->_vptr_Constraint[9])(peVar1,&local_270),
         (char)iVar5 != '\0')) {
        bVar4 = SparsityStructure::isValid(&local_270);
        if (!bVar4) {
          pcVar10 = 
          "The control sparsity is provided but the dimension of the two vectors do not match.";
          goto LAB_001add8a;
        }
        SparsityStructure::merge(&this->groupControlJacobianSparsity,&local_270);
      }
      else {
        this->controlJacobianSparsityProvided = false;
      }
      SparsityStructure::~SparsityStructure(&local_270);
      SparsityStructure::~SparsityStructure(local_208);
      SparsityStructure::SparsityStructure(local_208);
      SparsityStructure::SparsityStructure(&local_270);
      SparsityStructure::SparsityStructure(&local_90);
      if ((this->stateHessianSparsityProvided == true) &&
         (peVar1 = (constraint->
                   super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar5 = (*peVar1->_vptr_Constraint[0xd])(peVar1,local_208),
         (char)iVar5 != '\0')) {
        bVar4 = SparsityStructure::isValid(local_208);
        if (bVar4) {
          SparsityStructure::merge(&this->groupStateHessianSparsity,local_208);
          goto LAB_001adcdc;
        }
        pcVar10 = 
        "The state hessian sparsity is provided but the dimension of the two vectors do not match.";
LAB_001addd2:
        iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar10);
        bVar4 = false;
      }
      else {
        this->stateHessianSparsityProvided = false;
LAB_001adcdc:
        if ((this->controlHessianSparsityProvided == true) &&
           (peVar1 = (constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, iVar5 = (*peVar1->_vptr_Constraint[0xf])(peVar1,&local_270),
           (char)iVar5 != '\0')) {
          bVar4 = SparsityStructure::isValid(&local_270);
          if (!bVar4) {
            pcVar10 = 
            "The control hessian sparsity is provided but the dimension of the two vectors do not match."
            ;
            goto LAB_001addd2;
          }
          SparsityStructure::merge(&this->groupControlHessianSparsity,&local_270);
        }
        else {
          this->controlHessianSparsityProvided = false;
        }
        if ((this->mixedHessianSparsityProvided == true) &&
           (peVar1 = (constraint->
                     super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, iVar5 = (*peVar1->_vptr_Constraint[0xe])(peVar1,&local_90),
           (char)iVar5 != '\0')) {
          bVar4 = SparsityStructure::isValid(&local_90);
          if (!bVar4) {
            pcVar10 = 
            "The state control hessian sparsity is provided but the dimension of the two vectors do not match."
            ;
            goto LAB_001addd2;
          }
          bVar4 = true;
          SparsityStructure::merge(&this->groupMixedHessianSparsity,&local_90);
        }
        else {
          this->mixedHessianSparsityProvided = false;
          bVar4 = true;
        }
      }
      SparsityStructure::~SparsityStructure(&local_90);
      SparsityStructure::~SparsityStructure(&local_270);
      SparsityStructure::~SparsityStructure(local_208);
      goto LAB_001ade0b;
    }
    bVar4 = SparsityStructure::isValid(local_208);
    if (bVar4) {
      SparsityStructure::merge(&this->groupStateJacobianSparsity,local_208);
      goto LAB_001adc0a;
    }
    pcVar10 = "The state sparsity is provided but the dimension of the two vectors do not match.";
LAB_001add8a:
    iDynTree::reportError("ConstraintsGroup","addConstraint",pcVar10);
    SparsityStructure::~SparsityStructure(&local_270);
    SparsityStructure::~SparsityStructure(local_208);
  }
  bVar4 = false;
LAB_001ade0b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_280.
              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar4;
}

Assistant:

bool addConstraint(std::shared_ptr<Constraint> constraint, const TimeRange &timeRange)
            {
                if (!constraint){
                    reportError("ConstraintsGroup", "addConstraint", "Empty constraint pointer.");
                    return false;
                }

                if (constraint->constraintSize() > maxConstraintSize){
                    reportError("ConstraintsGroup", "addConstraint", "The constraint dimension is greater than the maximum allowed by the group.");
                    return false;
                }

                if (timeRange == TimeRange::AnyTime()){
                    if (group.size() != 0){
                        reportError("ConstraintsGroup", "addConstraint",
                                    "Only one constraint is allowed in a group if the timeRange is AnyTime.");
                        return false;
                    }
                } else {
                    if (!timeRange.isValid()){
                        reportError("ConstraintsGroup", "addConstraint", "Invalid timeRange.");
                        return false;
                    }
                }

                if(group.size() > 0){
                    GroupOfConstraintsMap::iterator constraintIterator;
                    constraintIterator = group.find(constraint->name());
                    if(constraintIterator != group.end()){
                        std::ostringstream errorMsg;
                        errorMsg << "A constraint named " << constraint->name()
                                 <<" already exists in the group "<< name << " .";
                        reportError("ConstraintsGroup", "addConstraint", errorMsg.str().c_str());
                        return false;
                    }
                }

                //add constraints in the group
                TimedConstraint_ptr newConstraint = std::make_shared<TimedConstraint>();

                newConstraint->timeRange = timeRange;
                newConstraint->constraint = constraint;
                newConstraint->constraintBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()));
                newConstraint->stateJacobianBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()), static_cast<unsigned int>(constraint->expectedStateSpaceSize()));
                newConstraint->controlJacobianBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()), static_cast<unsigned int>(constraint->expectedControlSpaceSize()));
                newConstraint->lambdaBuffer.resize(static_cast<unsigned int>(constraint->constraintSize()));


                std::pair< GroupOfConstraintsMap::iterator, bool> result;
                result = group.insert(GroupOfConstraintsMap::value_type(constraint->name(), newConstraint));

                if(!result.second){
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to add constraint "<<constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "addConstraint", errorMsg.str().c_str());
                    return false;
                }

                orderedIntervals.push_back(result.first->second); //register the time range in order to have the constraints ordered by init time. result.first->second is the TimedConstraint_ptr of the newly inserted TimedConstraint.
                std::sort(orderedIntervals.begin(), orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector

                {
                    SparsityStructure newConstraintStateJacobianSparsity, newConstraintControlJacobianSparsity;

                    if (stateJacobianSparsityProvided
                        && constraint->constraintJacobianWRTStateSparsity(newConstraintStateJacobianSparsity)) {

                        if (!newConstraintStateJacobianSparsity.isValid()) {
                            reportError("ConstraintsGroup", "addConstraint", "The state sparsity is provided but the dimension of the two vectors do not match.");
                            return false;
                        }

                        groupStateJacobianSparsity.merge(newConstraintStateJacobianSparsity);

                    } else {
                        stateJacobianSparsityProvided = false;
                    }

                    if (controlJacobianSparsityProvided
                        && constraint->constraintJacobianWRTControlSparsity(newConstraintControlJacobianSparsity)) {

                        if (!newConstraintControlJacobianSparsity.isValid()) {
                            reportError("ConstraintsGroup", "addConstraint", "The control sparsity is provided but the dimension of the two vectors do not match.");
                            return false;
                        }

                        groupControlJacobianSparsity.merge(newConstraintControlJacobianSparsity);

                    } else {
                        controlJacobianSparsityProvided = false;
                    }
                }

                SparsityStructure newConstraintStateHessianSparsity, newConstraintControlHessianSparsity, newConstraintMixedHessianSparsity;

                if (stateHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTStateSparsity(newConstraintStateHessianSparsity)) {

                    if (!newConstraintStateHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The state hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupStateHessianSparsity.merge(newConstraintStateHessianSparsity);

                } else {
                    stateHessianSparsityProvided = false;
                }

                if (controlHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTControlSparsity(newConstraintControlHessianSparsity)) {

                    if (!newConstraintControlHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The control hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupControlHessianSparsity.merge(newConstraintControlHessianSparsity);

                } else {
                    controlHessianSparsityProvided = false;
                }

                if (mixedHessianSparsityProvided
                    && constraint->constraintSecondPartialDerivativeWRTStateControlSparsity(newConstraintMixedHessianSparsity)) {

                    if (!newConstraintMixedHessianSparsity.isValid()) {
                        reportError("ConstraintsGroup", "addConstraint", "The state control hessian sparsity is provided but the dimension of the two vectors do not match.");
                        return false;
                    }

                    groupMixedHessianSparsity.merge(newConstraintMixedHessianSparsity);

                } else {
                    mixedHessianSparsityProvided = false;
                }

                return true;
            }